

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O2

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,assign_statement_t *stmt)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *__x;
  element_type *peVar1;
  long lVar2;
  integer_variables_t *piVar3;
  clock_variables_t *pcVar4;
  expression_t *expr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  assign_statement_t *paVar6;
  statement_type_t stmt_type;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> typed_lvalue;
  undefined1 local_10c [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  shared_ptr<const_tchecker::typed_expression_t> local_e8;
  pointer local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_c8;
  integer_variables_t *local_c0;
  assign_statement_t *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_70;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  peVar1 = (stmt->_lvalue).
           super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar2 = *(long *)((long)*peVar1 + -0x38);
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  __x = &this->_error;
  local_b8 = stmt;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_50,__x);
  local_c0 = &this->_localvars;
  typecheck((tchecker *)(local_10c + 4),(expression_t *)((long)&peVar1->field_0x0 + lVar2),
            &this->_localvars,piVar3,pcVar4,&local_50);
  std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::typed_expression_t>
            ((shared_ptr<tchecker::typed_expression_t> *)&local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
  std::_Function_base::~_Function_base(&local_50.super__Function_base);
  paVar6 = local_b8;
  expr = (local_b8->_rvalue).
         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_70,__x);
  local_c8 = __x;
  typecheck((tchecker *)(local_10c + 4),expr,local_c0,piVar3,pcVar4,&local_70);
  local_d8 = local_108._M_dataplus._M_p;
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._M_string_length;
  local_108._M_dataplus._M_p = (pointer)0x0;
  local_108._M_string_length = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
  std::_Function_base::~_Function_base(&local_70.super__Function_base);
  local_10c = (undefined1  [4])
              type_assign(*(expression_type_t *)
                           (&(local_e8.
                              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->field_0x0 + 8),*(expression_type_t *)(local_d8 + 8));
  if (local_10c == (undefined1  [4])0x3) {
    std::
    make_shared<tchecker::typed_int_to_clock_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
              ((statement_type_t *)(local_10c + 4),
               (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_10c,&local_e8);
    std::__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2> *)
               &this->_typed_stmt,
               (__shared_ptr<tchecker::typed_int_to_clock_assign_statement_t,_(__gnu_cxx::_Lock_policy)2>
                *)(local_10c + 4));
  }
  else {
    if (local_10c == (undefined1  [4])0x4) {
      std::
      dynamic_pointer_cast<tchecker::typed_lvalue_expression_t_const,tchecker::typed_expression_t_const>
                ((shared_ptr<const_tchecker::typed_expression_t> *)&local_b0);
      std::
      make_shared<tchecker::typed_clock_to_clock_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>>
                ((statement_type_t *)(local_10c + 4),
                 (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_10c,
                 (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)&local_e8);
      std::__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2> *)
                 &this->_typed_stmt,
                 (__shared_ptr<tchecker::typed_clock_to_clock_assign_statement_t,_(__gnu_cxx::_Lock_policy)2>
                  *)(local_10c + 4));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_108._M_string_length);
      pbVar5 = &local_b0;
      goto LAB_001c0d66;
    }
    if (local_10c == (undefined1  [4])0x5) {
      std::
      make_shared<tchecker::typed_sum_to_clock_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
                ((statement_type_t *)(local_10c + 4),
                 (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_10c,&local_e8);
      std::__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2> *)
                 &this->_typed_stmt,
                 (__shared_ptr<tchecker::typed_sum_to_clock_assign_statement_t,_(__gnu_cxx::_Lock_policy)2>
                  *)(local_10c + 4));
    }
    else {
      std::
      make_shared<tchecker::typed_assign_statement_t,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
                ((statement_type_t *)(local_10c + 4),
                 (shared_ptr<const_tchecker::typed_lvalue_expression_t> *)local_10c,&local_e8);
      std::__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<tchecker::typed_statement_t,(__gnu_cxx::_Lock_policy)2> *)
                 &this->_typed_stmt,
                 (__shared_ptr<tchecker::typed_assign_statement_t,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_10c + 4));
    }
  }
  pbVar5 = &local_108;
LAB_001c0d66:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pbVar5->_M_string_length);
  if (((local_10c == (undefined1  [4])0x0) &&
      (*(expression_type_t *)
        (&(local_e8.
           super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->field_0x0 + 8) != EXPR_TYPE_BAD)) && (*(int *)(local_d8 + 8) != 0)) {
    statement_t::to_string_abi_cxx11_
              (&local_90,
               (statement_t *)((long)&paVar6->field_0x0 + *(long *)(*(long *)paVar6 + -0x38)));
    std::operator+(&local_b0,"in statement ",&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_10c + 4),&local_b0,", invalid assignement");
    std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (local_10c + 4));
    std::__cxx11::string::~string((string *)(local_10c + 4));
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_e8.
              super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

virtual void visit(tchecker::assign_statement_t const & stmt)
  {
    // Left and right values
    auto typed_lvalue = std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(
        tchecker::typecheck(stmt.lvalue(), _localvars, _intvars, _clocks, _error));

    std::shared_ptr<tchecker::typed_expression_t const> typed_rvalue =
        tchecker::typecheck(stmt.rvalue(), _localvars, _intvars, _clocks, _error);

    // Typed statement
    enum tchecker::statement_type_t stmt_type = type_assign(typed_lvalue->type(), typed_rvalue->type());

    switch (stmt_type) {
    case STMT_TYPE_CLKASSIGN_INT:
      _typed_stmt = std::make_shared<tchecker::typed_int_to_clock_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    case STMT_TYPE_CLKASSIGN_CLK:
      _typed_stmt = std::make_shared<tchecker::typed_clock_to_clock_assign_statement_t>(
          stmt_type, typed_lvalue, std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(typed_rvalue));
      break;
    case STMT_TYPE_CLKASSIGN_SUM:
      _typed_stmt = std::make_shared<tchecker::typed_sum_to_clock_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    default: // either STMT_TYPE_INTASSIGN or STMT_TYPE_BAD
      _typed_stmt = std::make_shared<tchecker::typed_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    }

    // Report bad type
    if (stmt_type != tchecker::STMT_TYPE_BAD)
      return;

    if ((typed_lvalue->type() != tchecker::EXPR_TYPE_BAD) && (typed_rvalue->type() != tchecker::EXPR_TYPE_BAD))
      _error("in statement " + stmt.to_string() + ", invalid assignement");
  }